

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_resources_get_builtin_resource_list_for_type
          (spvc_resources resources,spvc_builtin_resource_type type,
          spvc_reflected_builtin_resource **resource_list,size_t *resource_size)

{
  spvc_context_s *this;
  long lVar1;
  allocator local_31;
  string local_30;
  
  if (type == SPVC_BUILTIN_RESOURCE_TYPE_STAGE_INPUT) {
    lVar1 = 0xbe0;
  }
  else {
    if (type != SPVC_BUILTIN_RESOURCE_TYPE_STAGE_OUTPUT) {
      this = resources->context;
      std::__cxx11::string::string((string *)&local_30,"Invalid argument.",&local_31);
      spvc_context_s::report_error(this,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      return SPVC_ERROR_INVALID_ARGUMENT;
    }
    lVar1 = 0xcf8;
  }
  *resource_size =
       *(size_t *)((resources->uniform_buffers).stack_storage.aligned_char + lVar1 + -0x20);
  *resource_list =
       *(spvc_reflected_builtin_resource **)
        ((resources->uniform_buffers).stack_storage.aligned_char + lVar1 + -0x28);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_resources_get_builtin_resource_list_for_type(
		spvc_resources resources, spvc_builtin_resource_type type,
		const spvc_reflected_builtin_resource **resource_list,
		size_t *resource_size)
{
	const SmallVector<spvc_reflected_builtin_resource> *list = nullptr;
	switch (type)
	{
	case SPVC_BUILTIN_RESOURCE_TYPE_STAGE_INPUT:
		list = &resources->builtin_inputs;
		break;

	case SPVC_BUILTIN_RESOURCE_TYPE_STAGE_OUTPUT:
		list = &resources->builtin_outputs;
		break;

	default:
		break;
	}

	if (!list)
	{
		resources->context->report_error("Invalid argument.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	*resource_size = list->size();
	*resource_list = list->data();
	return SPVC_SUCCESS;
}